

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void getString(char *attrName,int argc,char **argv,int *i,int part,SetAttrVector *attrs,
              _func_void_char_ptr_char_ptr *check)

{
  invalid_argument *this;
  SetAttr *this_00;
  int *in_RCX;
  long in_RDX;
  int in_ESI;
  undefined8 in_RDI;
  undefined4 in_R8D;
  code *in_stack_00000008;
  char *str;
  value_type *__x;
  vector<SetAttr,_std::allocator<SetAttr>_> *this_01;
  undefined4 in_stack_ffffffffffffff08;
  allocator<char> *in_stack_ffffffffffffff30;
  undefined6 in_stack_ffffffffffffff38;
  undefined1 in_stack_ffffffffffffff3e;
  undefined1 uVar1;
  allocator<char> in_stack_ffffffffffffff3f;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff40;
  allocator<char> local_99;
  string local_98 [80];
  value_type *local_48;
  undefined4 local_24;
  int *local_20;
  
  if (in_ESI + -2 < *in_RCX) {
    this = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(this,"Expected a string");
    __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_48 = *(value_type **)(in_RDX + (long)(*in_RCX + 1) * 8);
  local_24 = in_R8D;
  local_20 = in_RCX;
  if (in_stack_00000008 != (code *)0x0) {
    (*in_stack_00000008)(in_RDI,local_48);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff40,
             (char *)CONCAT17(in_stack_ffffffffffffff3f,
                              CONCAT16(in_stack_ffffffffffffff3e,in_stack_ffffffffffffff38)),
             in_stack_ffffffffffffff30);
  this_00 = (SetAttr *)operator_new(0x28);
  uVar1 = 1;
  this_01 = (vector<SetAttr,_std::allocator<SetAttr>_> *)&stack0xffffffffffffff3f;
  __x = local_48;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff40,
             (char *)CONCAT17(in_stack_ffffffffffffff3f,CONCAT16(uVar1,in_stack_ffffffffffffff38)),
             in_stack_ffffffffffffff30);
  Imf_3_4::TypedAttribute<std::__cxx11::string>::TypedAttribute((string *)this_00);
  SetAttr::SetAttr(this_00,(string *)CONCAT44(local_24,in_stack_ffffffffffffff08),
                   (int)((ulong)this_01 >> 0x20),(Attribute *)__x);
  std::vector<SetAttr,_std::allocator<SetAttr>_>::push_back(this_01,__x);
  SetAttr::~SetAttr((SetAttr *)0x105e11);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff40);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff3f);
  std::__cxx11::string::~string(local_98);
  std::allocator<char>::~allocator(&local_99);
  *local_20 = *local_20 + 2;
  return;
}

Assistant:

void
getString (
    const char     attrName[],
    int            argc,
    char**         argv,
    int&           i,
    int            part,
    SetAttrVector& attrs,
    void (*check) (const char attrName[], const char str[]) = 0)
{
    if (i > argc - 2) throw invalid_argument ("Expected a string");

    const char* str = argv[i + 1];

    if (check) check (attrName, str);

    attrs.push_back (SetAttr (attrName, part, new StringAttribute (str)));
    i += 2;
}